

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O0

png_bytepp readPngFile(string *path,int *rowBytes,int *width,int *height)

{
  int iVar1;
  undefined4 uVar2;
  char *pcVar3;
  runtime_error *prVar4;
  size_t sVar5;
  __jmp_buf_tag *__env;
  png_bytepp pppVar6;
  png_byte *ppVar7;
  int local_21c;
  int y;
  png_bytepp rows;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long local_180;
  png_infop pngInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long local_130;
  png_structp png;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_94;
  undefined1 local_8d;
  int cmpNum;
  allocator local_79;
  string local_78;
  string local_58;
  FILE *local_38;
  FILE *file;
  uchar header [8];
  int *height_local;
  int *width_local;
  int *rowBytes_local;
  string *path_local;
  
  header = (uchar  [8])height;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_38 = fopen(pcVar3,"rb");
  if (local_38 == (FILE *)0x0) {
    local_8d = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"Couldn\'t open %s for reading!\n",&local_79);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    formatString<char_const*>(&local_58,&local_78,pcVar3);
    std::runtime_error::runtime_error(prVar4,(string *)&local_58);
    local_8d = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_94 = 8;
  sVar5 = fread(&file,1,8,local_38);
  if (sVar5 != 8) {
    fclose(local_38);
    local_d9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d8,"Error in reading ",path);
    std::operator+(&local_b8,&local_d8,": png is wayyy to small lmao!\n");
    std::runtime_error::runtime_error(prVar4,(string *)&local_b8);
    local_d9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = png_sig_cmp(&file,0,8);
  if (iVar1 != 0) {
    fclose(local_38);
    png._7_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"Error in reading ",path);
    std::operator+(&local_100,&local_120,": this is not a valid png!\n");
    std::runtime_error::runtime_error(prVar4,(string *)&local_100);
    png._7_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_130 = png_create_read_struct("1.6.37",0,0);
  if (local_130 == 0) {
    fclose(local_38);
    pngInfo._7_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_170,"Error in libpng for ",path);
    std::operator+(&local_150,&local_170,"!\n");
    std::runtime_error::runtime_error(prVar4,(string *)&local_150);
    pngInfo._7_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_180 = png_create_info_struct(local_130);
  if (local_180 == 0) {
    fclose(local_38);
    png_destroy_read_struct(&local_130,0);
    local_1c1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1c0,"Error in libpng for ",path);
    std::operator+(&local_1a0,&local_1c0,"!\n");
    std::runtime_error::runtime_error(prVar4,(string *)&local_1a0);
    local_1c1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_130,longjmp,200);
  iVar1 = _setjmp(__env);
  if (iVar1 != 0) {
    fclose(local_38);
    png_destroy_read_struct(&local_130,0);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_208,"Error in libpng for ",path);
    std::operator+(&local_1e8,&local_208,"!\n");
    std::runtime_error::runtime_error(prVar4,(string *)&local_1e8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  png_init_io(local_130,local_38);
  png_set_sig_bytes(local_130,8);
  png_read_info(local_130,local_180);
  if (width != (int *)0x0) {
    iVar1 = png_get_image_width(local_130,local_180);
    *width = iVar1;
  }
  if (header != (uchar  [8])0x0) {
    uVar2 = png_get_image_height(local_130,local_180);
    *(undefined4 *)header = uVar2;
  }
  if (rowBytes != (int *)0x0) {
    iVar1 = png_get_rowbytes(local_130,local_180);
    *rowBytes = iVar1;
  }
  pppVar6 = (png_bytepp)malloc((long)*(int *)header << 3);
  for (local_21c = 0; local_21c < *(int *)header; local_21c = local_21c + 1) {
    ppVar7 = (png_byte *)malloc((long)*rowBytes);
    pppVar6[local_21c] = ppVar7;
  }
  png_read_image(local_130,pppVar6);
  png_destroy_read_struct(&local_130,&local_180,0);
  fclose(local_38);
  return pppVar6;
}

Assistant:

png_bytepp readPngFile(std::string path, int *rowBytes, int *width, int*height){
    unsigned char header[8];
    FILE *file = fopen(path.c_str(),"rb");
    if (file == nullptr)
        throw CANT_READ(path.c_str());

    const int cmpNum = 8;
    if( fread(header,1,cmpNum,file) != cmpNum){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": png is wayyy to small lmao!\n");
    }
    if (png_sig_cmp(header,0,cmpNum) != 0){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": this is not a valid png!\n");
    }

    png_structp png = png_create_read_struct(PNG_LIBPNG_VER_STRING,NULL,NULL,NULL);
    if (png == NULL){
        fclose(file);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_infop pngInfo = png_create_info_struct(png);
    if (pngInfo == nullptr){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    if (setjmp(png_jmpbuf(png))){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_init_io(png,file);
    png_set_sig_bytes(png, cmpNum);
    png_read_info(png,pngInfo);
    if(width != nullptr)
        *width = png_get_image_width(png, pngInfo);
    if (height != nullptr)
        *height = png_get_image_height(png, pngInfo);
    if (rowBytes != nullptr)
        *rowBytes = png_get_rowbytes(png, pngInfo);

    png_bytepp rows = (png_bytepp)malloc(sizeof(png_bytep) * *height);
    for(int y=0;y< *height;y++)
        rows[y] = (png_bytep)malloc(*rowBytes);
    png_read_image(png,rows);
    png_destroy_read_struct(&png, &pngInfo, NULL);

    fclose(file);
    return rows;
}